

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O0

void __thiscall
aggreports::FillTVaR
          (aggreports *this,
          map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
          *tail,int summary_id,int epcalc,double nextreturnperiod_value,OASIS_FLOAT tvar)

{
  mapped_type *this_00;
  value_type local_40;
  OASIS_FLOAT local_2c;
  double dStack_28;
  OASIS_FLOAT tvar_local;
  double nextreturnperiod_value_local;
  int epcalc_local;
  int summary_id_local;
  map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
  *tail_local;
  aggreports *this_local;
  
  local_2c = tvar;
  dStack_28 = nextreturnperiod_value;
  nextreturnperiod_value_local._0_4_ = epcalc;
  nextreturnperiod_value_local._4_4_ = summary_id;
  _epcalc_local = tail;
  tail_local = (map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                *)this;
  this_00 = std::
            map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
            ::operator[](tail,(key_type *)((long)&nextreturnperiod_value_local + 4));
  local_40.retperiod = dStack_28;
  local_40.tvar = local_2c;
  std::vector<TVaR,_std::allocator<TVaR>_>::push_back(this_00,&local_40);
  return;
}

Assistant:

void aggreports::FillTVaR(std::map<int, std::vector<TVaR>> &tail,
			  const int summary_id, const int epcalc,
			  const double nextreturnperiod_value,
			  const OASIS_FLOAT tvar) {

  tail[summary_id].push_back({nextreturnperiod_value, tvar});

}